

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwaitcondition_unix.cpp
# Opt level: O2

void __thiscall QWaitCondition::wakeOne(QWaitCondition *this)

{
  QWaitConditionPrivate *pQVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this->d);
  qt_report_pthread_error(iVar2,"QWaitCondition::wakeOne()","mutex lock");
  pQVar1 = this->d;
  iVar2 = pQVar1->wakeups + 1;
  if (pQVar1->waiters <= iVar2) {
    iVar2 = pQVar1->waiters;
  }
  pQVar1->wakeups = iVar2;
  iVar2 = pthread_cond_signal((pthread_cond_t *)&pQVar1->cond);
  qt_report_pthread_error(iVar2,"QWaitCondition::wakeOne()","cv signal");
  iVar2 = pthread_mutex_unlock((pthread_mutex_t *)this->d);
  qt_report_pthread_error(iVar2,"QWaitCondition::wakeOne()","mutex unlock");
  return;
}

Assistant:

void QWaitCondition::wakeOne()
{
    qt_report_pthread_error(pthread_mutex_lock(&d->mutex), "QWaitCondition::wakeOne()",
                            "mutex lock");
    d->wakeups = qMin(d->wakeups + 1, d->waiters);
    qt_report_pthread_error(pthread_cond_signal(&d->cond), "QWaitCondition::wakeOne()",
                            "cv signal");
    qt_report_pthread_error(pthread_mutex_unlock(&d->mutex), "QWaitCondition::wakeOne()",
                            "mutex unlock");
}